

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O3

void __thiscall QDockWidget::setFeatures(QDockWidget *this,DockWidgetFeatures features)

{
  uint uVar1;
  QDockWidgetPrivate *this_00;
  bool bVar2;
  QDockWidgetLayout *this_01;
  QDockWidgetGroupWindow *this_02;
  long in_FS_OFFSET;
  QFlagsStorage<QDockWidget::DockWidgetFeature> local_4c;
  undefined1 local_48 [8];
  QFlagsStorage<QDockWidget::DockWidgetFeature> *pQStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDockWidgetPrivate **)&(this->super_QWidget).field_0x8;
  uVar1 = (this_00->features).super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
          super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i;
  if (uVar1 != ((uint)features.super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
                      super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 0xf)) {
    (this_00->features).super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
    super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i =
         (uint)features.super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
               super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 0xf;
    QWidget::layout(&this->super_QWidget);
    this_01 = (QDockWidgetLayout *)
              QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
    QDockWidgetLayout::setVerticalTitleBar
              (this_01,SUB41(((uint)features.
                                    super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
                                    super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 8) >> 3,
                             0));
    QDockWidgetPrivate::updateButtons(this_00);
    QAction::setEnabled(SUB81(this_00->toggleViewAction,0));
    local_4c.i = (this_00->features).super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
                 super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i;
    pQStack_40 = &local_4c;
    local_48 = (undefined1  [8])0x0;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)local_48);
    QWidget::update(&this->super_QWidget);
    if (((uVar1 ^ (uint)features.super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
                        super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i) & 1) != 0) {
      bVar2 = QDockWidgetLayout::nativeWindowDeco(this_01);
      if (bVar2) {
        this_02 = (QDockWidgetGroupWindow *)
                  QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
        if ((this_02 == (QDockWidgetGroupWindow *)0x0) ||
           (((((this->super_QWidget).data)->window_flags).
             super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i & 1)
            != 0)) {
          local_48 = (undefined1  [8])0x0;
          pQStack_40 = (QFlagsStorage<QDockWidget::DockWidgetFeature> *)0xffffffffffffffff;
          QDockWidgetPrivate::setWindowState(this_00,(WindowStates)0x3,(QRect *)local_48);
        }
        else {
          QDockWidgetGroupWindow::adjustFlags(this_02);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockWidget::setFeatures(QDockWidget::DockWidgetFeatures features)
{
    Q_D(QDockWidget);
    features &= DockWidgetFeatureMask;
    if (d->features == features)
        return;
    const bool closableChanged = (d->features ^ features) & DockWidgetClosable;
    d->features = features;
    QDockWidgetLayout *layout
        = qobject_cast<QDockWidgetLayout*>(this->layout());
    layout->setVerticalTitleBar(features & DockWidgetVerticalTitleBar);
    d->updateButtons();
    d->toggleViewAction->setEnabled((d->features & DockWidgetClosable) == DockWidgetClosable);
    emit featuresChanged(d->features);
    update();
    if (closableChanged && layout->nativeWindowDeco()) {
        QDockWidgetGroupWindow *floatingTab = qobject_cast<QDockWidgetGroupWindow *>(parent());
        if (floatingTab && !isFloating()) {
            floatingTab->adjustFlags();
        } else {
            d->setWindowState({QDockWidgetPrivate::WindowState::Floating,
                               QDockWidgetPrivate::WindowState::Unplug});
        }
    }
}